

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O1

uint64 mkvmuxer::WriteVoidElement(IMkvWriter *writer,uint64 size)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  int32 iVar4;
  int extraout_var;
  undefined4 extraout_var_00;
  int extraout_var_01;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  uint64 uVar8;
  uint8 value;
  uint8 b;
  undefined1 local_2a;
  undefined1 local_29;
  
  if (writer != (IMkvWriter *)0x0) {
    uVar1 = size - 1;
    uVar6 = 0xffffffffffffffff;
    if ((((0x7e < uVar1) && (uVar6 = 0xfffffffffffffffe, 0x3ffe < uVar1)) &&
        (uVar6 = 0xfffffffffffffffd, 0x1ffffe < uVar1)) &&
       (((uVar6 = 0xfffffffffffffffc, 0xffffffe < uVar1 &&
         (uVar6 = 0xfffffffffffffffb, 0x7fffffffe < uVar1)) &&
        (uVar6 = 0xfffffffffffffffa, 0x3fffffffffe < uVar1)))) {
      uVar6 = (ulong)(uVar1 < 0x1ffffffffffff) | 0xfffffffffffffff8;
    }
    uVar6 = uVar6 + uVar1;
    lVar7 = 2;
    if (((0x7e < uVar6) && (lVar7 = 3, 0x3ffe < uVar6)) &&
       ((lVar7 = 4, 0x1ffffe < uVar6 &&
        (((lVar7 = 5, 0xffffffe < uVar6 && (lVar7 = 6, 0x7fffffffe < uVar6)) &&
         (lVar7 = 7, 0x3fffffffffe < uVar6)))))) {
      lVar7 = 9 - (ulong)(uVar6 < 0x1ffffffffffff);
    }
    uVar8 = lVar7 + uVar6;
    if (uVar8 == size) {
      iVar2 = (*writer->_vptr_IMkvWriter[1])(writer);
      if (-1 < extraout_var) {
        iVar3 = (*writer->_vptr_IMkvWriter[1])(writer);
        (*writer->_vptr_IMkvWriter[4])(writer,0xec,CONCAT44(extraout_var_00,iVar3));
        local_29 = 0xec;
        iVar3 = (**writer->_vptr_IMkvWriter)(writer,&local_29,1);
        if ((-1 < iVar3) && (iVar4 = WriteUInt(writer,uVar6), iVar4 == 0)) {
          local_2a = 0;
          if (0 < (int)uVar6) {
            do {
              iVar3 = (**writer->_vptr_IMkvWriter)(writer,&local_2a,1);
              if (iVar3 != 0) {
                return 0;
              }
              uVar5 = (int)uVar6 - 1;
              uVar6 = (ulong)uVar5;
            } while (uVar5 != 0);
          }
          iVar3 = (*writer->_vptr_IMkvWriter[1])(writer);
          if (CONCAT44(extraout_var_01,iVar3) - CONCAT44(extraout_var,iVar2) != uVar8) {
            uVar8 = 0;
          }
          if (extraout_var_01 < 0) {
            return 0;
          }
          return uVar8;
        }
      }
    }
  }
  return 0;
}

Assistant:

uint64 WriteVoidElement(IMkvWriter* writer, uint64 size) {
  if (!writer)
    return false;

  // Subtract one for the void ID and the coded size.
  uint64 void_entry_size = size - 1 - GetCodedUIntSize(size - 1);
  uint64 void_size = EbmlMasterElementSize(libwebm::kMkvVoid, void_entry_size) +
                     void_entry_size;

  if (void_size != size)
    return 0;

  const int64 payload_position = writer->Position();
  if (payload_position < 0)
    return 0;

  if (WriteID(writer, libwebm::kMkvVoid))
    return 0;

  if (WriteUInt(writer, void_entry_size))
    return 0;

  const uint8 value = 0;
  for (int32 i = 0; i < static_cast<int32>(void_entry_size); ++i) {
    if (writer->Write(&value, 1))
      return 0;
  }

  const int64 stop_position = writer->Position();
  if (stop_position < 0 ||
      stop_position - payload_position != static_cast<int64>(void_size))
    return 0;

  return void_size;
}